

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name,
          int import_and_disabled_model)

{
  byte bVar1;
  char *pcVar2;
  lys_import *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  ulong __n;
  long lVar9;
  uint uVar10;
  
  __n = (ulong)mod_nam_ns_len;
  if (cur_snode != (lys_node *)0x0) {
    bVar1 = (ctx->models).parsing_sub_modules_count;
    if ((bVar1 == 0) ||
       (plVar8 = (ctx->models).parsing_sub_modules[bVar1 - 1], cur_snode->module == plVar8)) {
      plVar8 = cur_snode->module;
    }
    plVar7 = lys_main_module(plVar8);
    pcVar2 = plVar7->name;
    iVar4 = strncmp(pcVar2,mod_name_ns,__n);
    if ((iVar4 == 0) && (pcVar2[__n] == '\0')) {
      return plVar7;
    }
    bVar1 = plVar8->imp_size;
    if ((ulong)bVar1 != 0) {
      plVar3 = plVar8->imp;
      lVar9 = 0;
      do {
        plVar8 = *(lys_module **)(plVar3->rev + lVar9 + -0x10);
        pcVar2 = plVar8->name;
        iVar4 = strncmp(pcVar2,mod_name_ns,__n);
        if ((iVar4 == 0) && (pcVar2[__n] == '\0')) {
          return plVar8;
        }
        lVar9 = lVar9 + 0x38;
      } while ((ulong)bVar1 * 0x38 - lVar9 != 0);
    }
  }
  iVar4 = (ctx->models).used;
  if (0 < iVar4) {
    uVar10 = 1;
    do {
      uVar5 = uVar10 - 1 & 0xffff;
      if ((is_name != 0) || ((*(ushort *)&(ctx->models).list[uVar5]->field_0x40 & 0xc0) == 0x80)) {
        plVar8 = (ctx->models).list[uVar5];
        pcVar2 = plVar8->name;
        iVar6 = strncmp(pcVar2,mod_name_ns,__n);
        if ((iVar6 == 0) && (pcVar2[__n] == '\0')) {
          return plVar8;
        }
      }
      uVar5 = uVar10 & 0xffff;
      uVar10 = uVar10 + 1;
    } while ((int)uVar5 < iVar4);
  }
  return (lys_module *)0x0;
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name, int import_and_disabled_model)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!import_and_disabled_model && (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled)) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}